

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveData.cpp
# Opt level: O3

size_t __thiscall CDirectiveData::getUnitSize(CDirectiveData *this)

{
  uint uVar1;
  
  uVar1 = this->mode - U8;
  if (uVar1 < 9) {
    return *(size_t *)(&DAT_00194220 + (ulong)uVar1 * 8);
  }
  return 0;
}

Assistant:

size_t CDirectiveData::getUnitSize() const
{
	switch (mode)
	{
	case EncodingMode::U8:
	case EncodingMode::Ascii:
	case EncodingMode::Sjis:
	case EncodingMode::Custom:
		return 1;
	case EncodingMode::U16:
		return 2;
	case EncodingMode::U32:
	case EncodingMode::Float:
		return 4;
	case EncodingMode::U64:
	case EncodingMode::Double:
		return 8;
	case EncodingMode::Invalid:
		break;
	}

	return 0;
}